

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::MergePartialFromCodedStream
          (VisionFeaturePrint_Objects *this,CodedInputStream *input)

{
  CodedInputStream *input_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  string *value_00;
  char *data;
  bool local_8a;
  bool local_89;
  VisionFeaturePrint_Objects_ObjectsVersion local_78;
  uint local_74;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  VisionFeaturePrint_Objects *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x100002c8 = input;
LAB_003696eb:
  do {
    _first_byte_or_zero = stack0xffffffffffffff98;
    kMax1ByteVarint = 0x3fff;
    tag_2 = 0;
    if (stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) {
      tag_2 = (uint32)*stack0xffffffffffffff98->buffer_;
      if ((char)*stack0xffffffffffffff98->buffer_ < '\x01') {
        if ((stack0xffffffffffffff98->buffer_end_ <= stack0xffffffffffffff98->buffer_ + 1) ||
           ((*stack0xffffffffffffff98->buffer_ & (stack0xffffffffffffff98->buffer_[1] ^ 0xff)) <
            0x80)) goto LAB_0036986a;
        uStack_30 = 0x3fff;
        tag_1 = (uint)stack0xffffffffffffff98->buffer_[1] * 0x80 +
                (*stack0xffffffffffffff98->buffer_ - 0x80);
        google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,2);
        local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
        local_35 = local_8a;
        pVar4 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
        google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
    }
    else {
LAB_0036986a:
      local_3c = google::protobuf::io::CodedInputStream::ReadTagFallback
                           (stack0xffffffffffffff98,tag_2);
      local_3d = local_3c - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    value._0_1_ = (undefined1)uStack_c;
    local_74 = local_10;
    p.first = local_74;
    if ((uStack_c & 1) == 0) {
LAB_003699e2:
      if ((p.first == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(p.first),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      bVar1 = google::protobuf::internal::WireFormatLite::SkipField(stack0xffffffffffffff98,p.first)
      ;
    }
    else {
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      input_00 = stack0xffffffffffffff98;
      if (iVar2 == 1) {
        if ((p.first & 0xff) != 8) goto LAB_003699e2;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,&local_78);
        if (!bVar1) {
          return false;
        }
        set_version(this,local_78);
        goto LAB_003696eb;
      }
      if ((iVar2 != 100) || ((p.first & 0xff) != 0x22)) goto LAB_003699e2;
      value_00 = add_output_abi_cxx11_(this);
      bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input_00,value_00);
      if (!bVar1) {
        return false;
      }
      iVar2 = output_size(this);
      output_abi_cxx11_(this,iVar2 + -1);
      data = (char *)std::__cxx11::string::data();
      iVar2 = output_size(this);
      output_abi_cxx11_(this,iVar2 + -1);
      iVar2 = std::__cxx11::string::length();
      bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        (data,iVar2,PARSE,
                         "CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.output");
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool VisionFeaturePrint_Objects::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.ObjectsVersion version = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_version(static_cast< ::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string output = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_output()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->output(this->output_size() - 1).data(),
            this->output(this->output_size() - 1).length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.output"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  return false;
#undef DO_
}